

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLoadXYZROTnodeBodyBushingGeneric::ComputeForceTorque
          (ChLoadXYZROTnodeBodyBushingGeneric *this,ChFrameMoving<double> *rel_AB,
          ChVector<double> *loc_force,ChVector<double> *loc_torque)

{
  plain_array<double,_36,_1,_32> *ppVar1;
  double dVar2;
  double *pdVar3;
  undefined8 uVar4;
  bool bVar5;
  double dVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  Index IVar10;
  uint uVar11;
  double *pdVar12;
  void *pvVar13;
  undefined8 *puVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar30;
  undefined1 auVar29 [16];
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ChVectorDynamic<> mF;
  ChVectorDynamic<> mSdt;
  ChVectorDynamic<> mS;
  ChVector<double> vect_rot;
  ChVector<double> v;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_108;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_f8;
  undefined1 local_e8 [16];
  double local_d8;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  ChVector<double> *local_a8;
  ChVector<double> *local_a0;
  double *local_98;
  double dStack_90;
  double dStack_88;
  undefined1 *puStack_80;
  double local_78;
  double dStack_70;
  long local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_118.m_storage.m_data = (double *)0x0;
  local_118.m_storage.m_rows = 0;
  local_a8 = loc_torque;
  local_a0 = loc_force;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,6);
  local_f8.m_storage.m_data = (double *)0x0;
  local_f8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_f8,6);
  local_108.m_storage.m_data = (double *)0x0;
  local_108.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_108,6);
  local_58 = 0.0;
  local_48 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[0] +
             (this->neutral_displacement).coord.pos.m_data[0];
  dStack_40 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[1] +
              (this->neutral_displacement).coord.pos.m_data[1];
  local_38 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[2] +
             (this->neutral_displacement).coord.pos.m_data[2];
  dVar19 = (this->neutral_displacement).coord.rot.m_data[0];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar19;
  dVar31 = (rel_AB->super_ChFrame<double>).coord.rot.m_data[2];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar31;
  dVar23 = (rel_AB->super_ChFrame<double>).coord.rot.m_data[1];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar23;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = (rel_AB->super_ChFrame<double>).coord.rot.m_data[0];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (this->neutral_displacement).coord.rot.m_data[2];
  dVar33 = (this->neutral_displacement).coord.rot.m_data[1];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar33;
  dVar2 = (rel_AB->super_ChFrame<double>).coord.rot.m_data[3];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar2;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (this->neutral_displacement).coord.rot.m_data[3];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar19 * dVar31;
  auVar43 = vfmadd231sd_fma(auVar43,auVar20,auVar32);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar19 * dVar23;
  auVar42 = vfmadd231sd_fma(auVar42,auVar20,auVar34);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar2 * dVar19;
  auVar41 = vfmadd231sd_fma(auVar44,auVar20,auVar22);
  auVar43 = vfmadd231sd_fma(auVar43,auVar40,auVar34);
  auVar42 = vfnmadd231sd_fma(auVar42,auVar40,auVar32);
  auVar41 = vfnmadd231sd_fma(auVar41,auVar38,auVar34);
  auVar34 = vfnmadd231sd_fma(auVar43,auVar37,auVar22);
  auVar43 = vfmadd231sd_fma(auVar42,auVar38,auVar22);
  auVar42 = vfmadd231sd_fma(auVar41,auVar37,auVar32);
  dVar19 = auVar34._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar19 * dVar19;
  auVar41 = vfmadd231sd_fma(auVar41,auVar43,auVar43);
  auVar41 = vfmadd231sd_fma(auVar41,auVar42,auVar42);
  if (auVar41._0_8_ <= 0.0) {
    local_60 = 1.0;
    local_50 = 0.0;
    dVar19 = 0.0;
  }
  else {
    local_c0 = auVar43._0_8_;
    local_b0 = auVar42._0_8_;
    auVar39._0_8_ = -dVar31;
    auVar39._8_8_ = 0x8000000000000000;
    auVar24._0_8_ = -dVar2;
    auVar24._8_8_ = 0x8000000000000000;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar33 * -dVar23;
    auVar42 = vfmadd213sd_fma(auVar27,auVar20,auVar35);
    auVar43 = vsqrtsd_avx(auVar41,auVar41);
    auVar42 = vfmadd213sd_fma(auVar32,auVar39,auVar42);
    auVar42 = vfmadd213sd_fma(auVar22,auVar24,auVar42);
    local_c8 = auVar43._0_8_;
    local_b8 = dVar19;
    dVar19 = atan2(local_c8,auVar42._0_8_);
    dVar23 = 1.0 / local_c8;
    dVar31 = dVar23 * local_b8;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar23 * local_c0;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar31 * dVar31;
    auVar43 = vfmadd231sd_fma(auVar36,auVar28,auVar28);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar23 * local_b0;
    auVar43 = vfmadd231sd_fma(auVar43,auVar25,auVar25);
    auVar43 = vsqrtsd_avx(auVar43,auVar43);
    dVar19 = dVar19 + dVar19;
    dVar33 = 1.0 / auVar43._0_8_;
    bVar5 = 2.2250738585072014e-308 <= auVar43._0_8_;
    local_60 = (double)((ulong)bVar5 * (long)(dVar23 * local_c0 * dVar33) +
                       (ulong)!bVar5 * 0x3ff0000000000000);
    local_58 = (double)((ulong)bVar5 * (long)(dVar31 * dVar33));
    local_50 = (double)((ulong)bVar5 * (long)(dVar23 * local_b0 * dVar33));
    if (dVar19 <= 3.141592653589793) {
      if (dVar19 < -3.141592653589793) {
        dVar31 = 6.283185307179586;
        goto LAB_00641851;
      }
    }
    else {
      dVar31 = -6.283185307179586;
LAB_00641851:
      dVar19 = dVar19 + dVar31;
    }
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar19;
    uVar4 = vcmpsd_avx512f(auVar21,ZEXT816(0x400921fb54442d18),0xe);
    bVar5 = (bool)((byte)uVar4 & 1);
    dVar19 = (double)((ulong)bVar5 * (long)(dVar19 + -6.283185307179586) +
                     (ulong)!bVar5 * (long)dVar19);
    if (dVar19 < -3.141592653589793) {
      dVar19 = dVar19 + 6.283185307179586;
    }
  }
  IVar10 = local_f8.m_storage.m_rows;
  pdVar12 = local_f8.m_storage.m_data;
  local_60 = local_60 * dVar19;
  local_58 = local_58 * dVar19;
  local_50 = local_50 * dVar19;
  if (local_f8.m_storage.m_rows < 3) goto LAB_00641c9f;
  uVar16 = 3;
  if (((ulong)local_f8.m_storage.m_data & 7) == 0) {
    uVar11 = -((uint)((ulong)local_f8.m_storage.m_data >> 3) & 0x1fffffff) & 7;
    if (uVar11 < 3) {
      uVar16 = uVar11;
    }
    if (uVar11 != 0) goto LAB_006418e0;
  }
  else {
LAB_006418e0:
    memcpy(local_f8.m_storage.m_data,&local_48,(ulong)(uVar16 * 8));
  }
  if (uVar16 < 3) {
    uVar15 = (ulong)(uVar16 << 3);
    memcpy((void *)((long)pdVar12 + uVar15),(void *)((long)&local_48 + uVar15),0x18 - uVar15);
  }
  if ((ulong)IVar10 < 6) goto LAB_00641c9f;
  pdVar3 = pdVar12 + 3;
  uVar16 = 3;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar11 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if (uVar11 < 3) {
      uVar16 = uVar11;
    }
    if (uVar11 != 0) goto LAB_00641948;
  }
  else {
LAB_00641948:
    memcpy(pdVar3,&local_60,(ulong)(uVar16 * 8));
  }
  if (uVar16 < 3) {
    uVar15 = (ulong)(uVar16 << 3);
    memcpy((void *)((long)pdVar12 + uVar15 + 0x18),(void *)((long)&local_60 + uVar15),0x18 - uVar15)
    ;
  }
  if (local_108.m_storage.m_rows < 3) goto LAB_00641c9f;
  uVar15 = 3;
  if (((ulong)local_108.m_storage.m_data & 7) == 0) {
    uVar16 = -((uint)((ulong)local_108.m_storage.m_data >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar16 < 3) {
      uVar15 = (ulong)uVar16;
    }
    if (uVar16 != 0) goto LAB_006419ae;
  }
  else {
LAB_006419ae:
    uVar17 = 0;
    do {
      local_108.m_storage.m_data[uVar17] = (rel_AB->coord_dt).pos.m_data[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  if (uVar15 < 3) {
    do {
      local_108.m_storage.m_data[uVar15] = (rel_AB->coord_dt).pos.m_data[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar15 != 3);
  }
  ChFrameMoving<double>::GetWvel_par(rel_AB);
  if (local_108.m_storage.m_rows < 6) goto LAB_00641c9f;
  uVar15 = 3;
  pdVar12 = local_108.m_storage.m_data + 3;
  if (((ulong)pdVar12 & 7) == 0) {
    uVar16 = -((uint)((ulong)pdVar12 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar16 < 3) {
      uVar15 = (ulong)uVar16;
    }
    if (uVar16 != 0) goto LAB_00641a2d;
  }
  else {
LAB_00641a2d:
    uVar17 = 0;
    do {
      pdVar12[uVar17] = (double)(&local_98)[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  if (uVar15 < 3) {
    do {
      pdVar12[uVar15] = (double)(&local_98)[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar15 != 3);
  }
  if ((local_f8.m_storage.m_rows != 6) || (local_108.m_storage.m_rows != 6)) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, 6, 6, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 6, 6, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  lVar18 = 0;
  dVar19 = *local_f8.m_storage.m_data;
  dVar31 = local_f8.m_storage.m_data[1];
  dVar23 = local_f8.m_storage.m_data[2];
  dVar33 = local_f8.m_storage.m_data[3];
  dVar2 = local_f8.m_storage.m_data[4];
  dVar6 = local_f8.m_storage.m_data[5];
  pdVar12 = (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
            .m_data.array + 4;
  do {
    pdVar3 = pdVar12 + -2;
    pdVar7 = pdVar12 + -1;
    dVar26 = *pdVar12;
    pdVar8 = pdVar12 + 1;
    ppVar1 = (plain_array<double,_36,_1,_32> *)(pdVar12 + -4);
    pdVar9 = pdVar12 + -3;
    pdVar12 = pdVar12 + 6;
    dVar26 = dVar19 * ppVar1->array[0] + dVar23 * *pdVar3 + dVar2 * dVar26;
    dVar30 = dVar31 * *pdVar9 + dVar33 * *pdVar7 + dVar6 * *pdVar8;
    auVar29._0_8_ = dVar26 + dVar30;
    auVar29._8_8_ = dVar26 + dVar30;
    pdVar3 = (double *)vmovlpd_avx(auVar29);
    (&local_98)[lVar18] = pdVar3;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 6);
  dVar19 = *local_108.m_storage.m_data;
  dVar31 = local_108.m_storage.m_data[1];
  dVar23 = local_108.m_storage.m_data[2];
  dVar33 = local_108.m_storage.m_data[3];
  dVar2 = local_108.m_storage.m_data[4];
  dVar6 = local_108.m_storage.m_data[5];
  pdVar12 = (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
            m_data.array + 4;
  lVar18 = 0;
  do {
    pdVar3 = pdVar12 + -2;
    pdVar7 = pdVar12 + -1;
    dVar26 = *pdVar12;
    pdVar8 = pdVar12 + 1;
    ppVar1 = (plain_array<double,_36,_1,_32> *)(pdVar12 + -4);
    pdVar9 = pdVar12 + -3;
    pdVar12 = pdVar12 + 6;
    (&local_98)[lVar18] =
         (double *)
         (dVar19 * ppVar1->array[0] + dVar23 * *pdVar3 + dVar2 * dVar26 +
          dVar31 * *pdVar9 + dVar33 * *pdVar7 + dVar6 * *pdVar8 + (double)(&local_98)[lVar18]);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 6);
  if (local_118.m_storage.m_rows != 6) {
    if (local_118.m_storage.m_data != (double *)0x0) {
      free((void *)local_118.m_storage.m_data[-1]);
    }
    pvVar13 = malloc(0x70);
    if (pvVar13 == (void *)0x0) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)(((ulong)pvVar13 & 0xffffffffffffffc0) + 0x38) = pvVar13;
    local_118.m_storage.m_data = (double *)(((ulong)pvVar13 & 0xffffffffffffffc0) + 0x40);
    local_118.m_storage.m_rows = 6;
  }
  local_118.m_storage.m_data[2] = dStack_88;
  local_118.m_storage.m_data[3] = (double)puStack_80;
  local_118.m_storage.m_data[4] = local_78;
  local_118.m_storage.m_data[5] = dStack_70;
  *local_118.m_storage.m_data = (double)local_98;
  local_118.m_storage.m_data[1] = dStack_90;
  local_118.m_storage.m_data[2] = dStack_88;
  local_118.m_storage.m_data[3] = (double)puStack_80;
  dStack_90 = 1.48219693752374e-323;
  local_78 = 0.0;
  local_68 = 6;
  local_98 = local_118.m_storage.m_data;
  puStack_80 = (undefined1 *)&local_118;
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
            ((ChVector<double> *)local_e8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &local_98,(type *)0x0);
  dVar19 = (this->neutral_force).m_data[2];
  auVar43 = vsubpd_avx(local_e8,*(undefined1 (*) [16])(this->neutral_force).m_data);
  *(undefined1 (*) [16])local_a0->m_data = auVar43;
  local_a0->m_data[2] = local_d8 - dVar19;
  local_98 = local_118.m_storage.m_data + 3;
  dStack_90 = 1.48219693752374e-323;
  local_78 = 1.48219693752374e-323;
  local_68 = local_118.m_storage.m_rows;
  puStack_80 = (undefined1 *)&local_118;
  if (5 < local_118.m_storage.m_rows) {
    puStack_80 = (undefined1 *)&local_118;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)local_e8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_98,(type *)0x0);
    dVar19 = (this->neutral_torque).m_data[2];
    auVar43 = vsubpd_avx(local_e8,*(undefined1 (*) [16])(this->neutral_torque).m_data);
    *(undefined1 (*) [16])local_a8->m_data = auVar43;
    local_a8->m_data[2] = local_d8 - dVar19;
    if (local_108.m_storage.m_data != (double *)0x0) {
      free((void *)local_108.m_storage.m_data[-1]);
    }
    if (local_f8.m_storage.m_data != (double *)0x0) {
      free((void *)local_f8.m_storage.m_data[-1]);
    }
    if (local_118.m_storage.m_data != (double *)0x0) {
      free((void *)local_118.m_storage.m_data[-1]);
    }
    return;
  }
LAB_00641c9f:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChLoadXYZROTnodeBodyBushingGeneric::ComputeForceTorque(const ChFrameMoving<>& rel_AB,
                                                            ChVector<>& loc_force,
                                                            ChVector<>& loc_torque) {
    // compute local force & torque (assuming small rotations):
    ChVectorDynamic<> mF(6);
    ChVectorDynamic<> mS(6);
    ChVectorDynamic<> mSdt(6);
    ChVector<> rel_pos = rel_AB.GetPos() + neutral_displacement.GetPos();
    ChQuaternion<> rel_rot = rel_AB.GetRot() * neutral_displacement.GetRot();
    ChVector<> dir_rot;
    double angle_rot;
    rel_rot.Q_to_AngAxis(angle_rot, dir_rot);
    if (angle_rot > CH_C_PI)
        angle_rot -= CH_C_2PI;
    if (angle_rot < -CH_C_PI)
        angle_rot += CH_C_2PI;
    ChVector<> vect_rot = dir_rot * angle_rot;

    mS.segment(0, 3) = rel_pos.eigen();
    mS.segment(3, 3) = vect_rot.eigen();
    mSdt.segment(0, 3) = rel_AB.GetPos_dt().eigen();
    mSdt.segment(3, 3) = rel_AB.GetWvel_par().eigen();

    mF = stiffness * mS + damping * mSdt;

    loc_force = ChVector<>(mF.segment(0, 3)) - neutral_force;
    loc_torque = ChVector<>(mF.segment(3, 3)) - neutral_torque;
}